

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O0

bool __thiscall
ON_Sphere::ClosestPointTo(ON_Sphere *this,ON_3dPoint point,double *longitude,double *latitude)

{
  double dVar1;
  double dVar2;
  double __y;
  double local_60;
  double r;
  double y;
  double x;
  double h;
  ON_3dVector v;
  bool rc;
  double *latitude_local;
  double *longitude_local;
  ON_Sphere *this_local;
  
  v.z._7_1_ = 1;
  ON_3dPoint::operator-((ON_3dVector *)&h,&point,(ON_3dPoint *)this);
  dVar1 = ON_3dVector::operator*((ON_3dVector *)&h,&(this->plane).zaxis);
  dVar2 = ON_3dVector::operator*((ON_3dVector *)&h,&(this->plane).xaxis);
  __y = ON_3dVector::operator*((ON_3dVector *)&h,&(this->plane).yaxis);
  if ((((dVar2 != 0.0) || (NAN(dVar2))) || (__y != 0.0)) || (NAN(__y))) {
    if (ABS(dVar2) < ABS(__y)) {
      local_60 = sqrt((dVar2 / __y) * (dVar2 / __y) + 1.0);
      local_60 = ABS(__y) * local_60;
    }
    else {
      local_60 = sqrt((__y / dVar2) * (__y / dVar2) + 1.0);
      local_60 = ABS(dVar2) * local_60;
    }
    if (longitude != (double *)0x0) {
      dVar2 = atan2(__y,dVar2);
      *longitude = dVar2;
      if (*longitude <= 0.0 && *longitude != 0.0) {
        *longitude = *longitude + 6.283185307179586;
      }
      if ((*longitude <= 0.0 && *longitude != 0.0) || (6.283185307179586 <= *longitude)) {
        *longitude = 0.0;
      }
    }
    if (latitude != (double *)0x0) {
      dVar1 = atan(dVar1 / local_60);
      *latitude = dVar1;
    }
  }
  else {
    if (longitude != (double *)0x0) {
      *longitude = 0.0;
    }
    if (latitude != (double *)0x0) {
      *latitude = (double)(~-(ulong)(0.0 <= dVar1) & 0xbff921fb54442d18 |
                          -(ulong)(0.0 <= dVar1) & 0x3ff921fb54442d18);
    }
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      v.z._7_1_ = 0;
    }
  }
  return (bool)(v.z._7_1_ & 1);
}

Assistant:

bool ON_Sphere::ClosestPointTo( 
       ON_3dPoint point, 
       double* longitude,
       double* latitude
       ) const
{
  bool rc = true;
  ON_3dVector v = point - plane.origin;
  double h = v*plane.zaxis;
  double x = v*plane.xaxis;
  double y = v*plane.yaxis;
  double r = 1.0;
  if ( x == 0.0 && y == 0.0 ) {
    if ( longitude )
      *longitude = 0.0;
    if ( latitude )
      *latitude = (h>=0.0) ? 0.5*ON_PI : -0.5*ON_PI;
    if ( h == 0.0 )
      rc = false;
  }
  else {
    if ( fabs(x) >= fabs(y) ) {
      r = y/x;
      r = fabs(x)*sqrt(1.0+r*r);
    }
    else {
      r = x/y;
      r = fabs(y)*sqrt(1.0+r*r);
    }
    if ( longitude ) {
      *longitude = atan2(y,x);
      if ( *longitude < 0.0 )
        *longitude += 2.0*ON_PI;
      if ( *longitude < 0.0 || *longitude >= 2.0*ON_PI)
        *longitude = 0.0;
    }
    if ( latitude )
      *latitude = atan(h/r);
  }
  return rc;
}